

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# await.c
# Opt level: O2

int main(void)

{
  future_t *pfVar1;
  future_t *pfVar2;
  callable_t callable;
  callable_t callable_00;
  callable_t callable_01;
  callable_t callable_02;
  callable_t callable_03;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 auStack_2e8 [8];
  int n;
  size_t local_2d8;
  future_t local_2a8;
  future_t local_268;
  future_t local_228;
  future_t local_1e8;
  undefined1 auStack_1a8 [8];
  future_t tab [5];
  undefined4 local_50;
  undefined4 local_4c;
  int n_3;
  int n2;
  int n_1;
  undefined8 local_38;
  
  thread_pool_init(&pool,2);
  tab[0].callable = (callable_t *)auStack_2e8;
  auStack_2e8._0_4_ = 0x10;
  auStack_1a8 = (undefined1  [8])squared;
  tab[0].result = (void *)0x4;
  callable.arg = tab[0].callable;
  callable.function = squared;
  callable.argsz = 4;
  async(&pool,&future,callable);
  piVar3 = (int *)await(&future);
  if (*piVar3 == 0x100) {
    free(piVar3);
    thread_pool_destroy(&pool);
    tests_run = tests_run + 1;
    thread_pool_init(&pool,2);
    _n_3 = (code *)CONCAT44(n2,2);
    auStack_2e8 = (undefined1  [8])squared;
    local_2d8 = 4;
    callable_00.arg = &n_3;
    callable_00.function = squared;
    callable_00.argsz = 4;
    _n = &n_3;
    async(&pool,(future_t *)auStack_1a8,callable_00);
    pfVar1 = (future_t *)((long)&tab[0].mutex + 0x18);
    map(&pool,pfVar1,(future_t *)auStack_1a8,squared_free);
    pfVar2 = (future_t *)((long)&tab[1].mutex + 0x18);
    map(&pool,pfVar2,pfVar1,div2_free);
    pfVar1 = (future_t *)((long)&tab[2].mutex + 0x18);
    map(&pool,pfVar1,pfVar2,squared_free);
    pfVar2 = (future_t *)((long)&tab[3].mutex + 0x18);
    map(&pool,pfVar2,pfVar1,squared_free);
    piVar3 = (int *)await(pfVar2);
    if (*piVar3 == 0x1000) {
      free(piVar3);
      thread_pool_destroy(&pool);
      tests_run = tests_run + 1;
      thread_pool_init(&pool,1);
      _n_3 = (code *)CONCAT44(n2,2);
      auStack_2e8 = (undefined1  [8])squared;
      local_2d8 = 4;
      callable_01.arg = &n_3;
      callable_01.function = squared;
      callable_01.argsz = 4;
      _n = &n_3;
      async(&pool,(future_t *)auStack_1a8,callable_01);
      pfVar1 = (future_t *)((long)&tab[0].mutex + 0x18);
      map(&pool,pfVar1,(future_t *)auStack_1a8,squared_free);
      pfVar2 = (future_t *)((long)&tab[1].mutex + 0x18);
      map(&pool,pfVar2,pfVar1,div2_free);
      pfVar1 = (future_t *)((long)&tab[2].mutex + 0x18);
      map(&pool,pfVar1,pfVar2,squared_free);
      uVar5 = 0;
      iVar4 = 0xbc4ff9;
      while( true ) {
        bVar7 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar7) break;
        uVar5 = (long)((int)uVar5 * 0xc + 0x520) % 0x1dc3760 & 0xffffffff;
      }
      pfVar2 = (future_t *)((long)&tab[3].mutex + 0x18);
      map(&pool,pfVar2,pfVar1,squared_free);
      piVar3 = (int *)await(pfVar2);
      if ((int)uVar5 == *piVar3) {
        pcVar6 = "nie";
        goto LAB_00101670;
      }
      if (*piVar3 == 0x1000) {
        free(piVar3);
        thread_pool_destroy(&pool);
        tests_run = tests_run + 1;
        thread_pool_init(&pool,1);
        _n_1 = &local_50;
        local_50 = 2;
        _n_3 = squared;
        local_38 = 4;
        callable_02.arg = _n_1;
        callable_02.function = squared;
        callable_02.argsz = 4;
        async(&pool,(future_t *)auStack_1a8,callable_02);
        pfVar1 = (future_t *)((long)&tab[0].mutex + 0x18);
        map(&pool,pfVar1,(future_t *)auStack_1a8,squared_free);
        pfVar2 = (future_t *)((long)&tab[1].mutex + 0x18);
        map(&pool,pfVar2,pfVar1,div2_free);
        pfVar1 = (future_t *)((long)&tab[2].mutex + 0x18);
        map(&pool,pfVar1,pfVar2,squared_free);
        pfVar2 = (future_t *)((long)&tab[3].mutex + 0x18);
        map(&pool,pfVar2,pfVar1,squared_free);
        piVar3 = (int *)await(pfVar2);
        if (*piVar3 == 0x1000) {
          free(piVar3);
          local_4c = 3;
          tab[4].mutex._24_8_ = squared;
          callable_03.arg = &local_4c;
          callable_03.function = squared;
          callable_03.argsz = 4;
          async(&pool,(future_t *)auStack_2e8,callable_03);
          map(&pool,&local_2a8,(future_t *)auStack_2e8,squared_free);
          map(&pool,&local_268,&local_2a8,div2_free);
          map(&pool,&local_228,&local_268,squared_free);
          map(&pool,&local_1e8,&local_228,squared_free);
          piVar3 = (int *)await(&local_1e8);
          if (*piVar3 == 0x271000) {
            free(piVar3);
            thread_pool_destroy(&pool);
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = "expected 2560000";
          }
          goto LAB_00101670;
        }
      }
    }
    pcVar6 = "expected 64 * 64";
  }
  else {
    pcVar6 = "expected 256";
  }
LAB_00101670:
  tests_run = tests_run + 1;
  if (pcVar6 == (char *)0x0) {
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/asledz[P]ASYNC_C/test/await.c ALL TESTS PASSED"
        );
  }
  else {
    printf("/workspace/llm4binary/github/license_all_cmakelists_1510/asledz[P]ASYNC_C/test/await.c %s\n"
           ,pcVar6);
  }
  printf("/workspace/llm4binary/github/license_all_cmakelists_1510/asledz[P]ASYNC_C/test/await.c Tests run: %d\n"
         ,(ulong)(uint)tests_run);
  return (int)(pcVar6 != (char *)0x0);
}

Assistant:

int main() {
    char *result = all_tests();
    if (result != 0) {
        printf(__FILE__ " %s\n", result);
    } else {
        printf(__FILE__ " ALL TESTS PASSED\n");
    }
    printf(__FILE__ " Tests run: %d\n", tests_run);

    return result != 0;
}